

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O0

uint16_t XPMP2::PJWHash16(char *pc)

{
  ushort uVar1;
  uchar *s;
  uint16_t high;
  uint16_t h;
  char *pc_local;
  
  h = 0;
  s = (uchar *)pc;
  while (*s != '\0') {
    h = h * 4 + (ushort)*s;
    uVar1 = h & 0xc000;
    if (uVar1 != 0) {
      h = h ^ (ushort)((int)(uint)uVar1 >> 0xe);
    }
    h = h & (uVar1 ^ 0xffff);
    s = s + 1;
  }
  return h;
}

Assistant:

std::uint16_t PJWHash16(const char *pc)
{
    std::uint16_t h = 0, high;
    const unsigned char* s = reinterpret_cast<const unsigned char*>(pc);
    while (*s)
    {
        h <<= 2;                    // shift by 2 bits only, not 4
        h += *s++;
        high = h & 0xC000;          // pick the upper 2 bits only, not 4
        if (high)
            h ^= high >> 14;
        h &= ~high;
    }
    return h;
}